

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_OffsetSurfaceFunction::PointAt
          (ON_3dPoint *__return_storage_ptr__,ON_OffsetSurfaceFunction *this,double s,double t)

{
  bool bVar1;
  double d;
  ON_3dVector local_68;
  ON_3dPoint local_50;
  undefined1 local_38 [8];
  ON_3dVector N;
  double t_local;
  double s_local;
  ON_OffsetSurfaceFunction *this_local;
  
  __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
  __return_storage_ptr__->y = ON_3dPoint::NanPoint.y;
  __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  local_38 = (undefined1  [8])ON_3dVector::NanVector.x;
  N.x = ON_3dVector::NanVector.y;
  N.y = ON_3dVector::NanVector.z;
  if ((this->m_srf != (ON_Surface *)0x0) &&
     (N.z = t, bVar1 = ON_Surface::EvNormal
                                 (this->m_srf,s,t,__return_storage_ptr__,(ON_3dVector *)local_38,0,
                                  (int *)0x0), bVar1)) {
    d = DistanceAt(this,s,N.z);
    ::operator*(&local_68,d,(ON_3dVector *)local_38);
    ON_3dPoint::operator+(&local_50,__return_storage_ptr__,&local_68);
    __return_storage_ptr__->x = local_50.x;
    __return_storage_ptr__->y = local_50.y;
    __return_storage_ptr__->z = local_50.z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_OffsetSurfaceFunction::PointAt(
  double s,
  double t
  ) const
{
  //double d = 0.0;
  ON_3dPoint P(ON_3dPoint::NanPoint);
  ON_3dVector N(ON_3dVector::NanVector);
  if ( 0 != m_srf )
  {
    if ( m_srf->EvNormal(s,t,P,N) )
    {
      P = P + DistanceAt(s,t)*N;
    }
  }
  return P;
}